

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_163::ConstantGlobalApplier::visitFunction
          (ConstantGlobalApplier *this,Function *curr)

{
  undefined1 local_188 [8];
  PassRunner runner;
  pointer local_80;
  pointer local_70;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_58;
  
  if (this->replaced == true) {
    if (this->refinalize == true) {
      ReFinalize::ReFinalize((ReFinalize *)local_188);
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
                ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
                 &runner.options.ignoreImplicitTraps,&curr->body);
      local_188 = (undefined1  [8])&PTR__ReFinalize_01070c30;
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_58);
      if (local_80 != (pointer)0x0) {
        operator_delete(local_80,(long)local_70 - (long)local_80);
      }
      Pass::~Pass((Pass *)local_188);
    }
    if (this->optimize == true) {
      PassRunner::PassRunner((PassRunner *)local_188,*(PassRunner **)&this->field_0x8);
      PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)local_188);
      PassRunner::runOnFunction((PassRunner *)local_188,curr);
      PassRunner::~PassRunner((PassRunner *)local_188);
    }
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    if (replaced) {
      if (refinalize) {
        ReFinalize().walkFunctionInModule(curr, this->getModule());
      }
      if (optimize) {
        PassRunner runner(getPassRunner());
        runner.addDefaultFunctionOptimizationPasses();
        runner.runOnFunction(curr);
      }
    }
  }